

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission_parse.cpp
# Opt level: O0

void __thiscall
FMapInfoParser::ParseIntermissionAction(FMapInfoParser *this,FIntermissionDescriptor *desc)

{
  bool bVar1;
  uint uVar2;
  FIntermissionActionTextscreen *pFVar3;
  byte local_2d;
  bool success;
  FIntermissionActionTextscreen *local_20;
  FIntermissionAction *ac;
  FIntermissionDescriptor *desc_local;
  FMapInfoParser *this_local;
  
  local_20 = (FIntermissionActionTextscreen *)0x0;
  ac = (FIntermissionAction *)desc;
  desc_local = (FIntermissionDescriptor *)this;
  FScanner::MustGetToken(&this->sc,0x101);
  bVar1 = FScanner::Compare(&this->sc,"image");
  if (bVar1) {
    pFVar3 = (FIntermissionActionTextscreen *)operator_new(0x60);
    FIntermissionAction::FIntermissionAction((FIntermissionAction *)pFVar3);
    local_20 = pFVar3;
  }
  else {
    bVar1 = FScanner::Compare(&this->sc,"scroller");
    if (bVar1) {
      pFVar3 = (FIntermissionActionTextscreen *)operator_new(0x78);
      FIntermissionActionScroller::FIntermissionActionScroller
                ((FIntermissionActionScroller *)pFVar3);
      local_20 = pFVar3;
    }
    else {
      bVar1 = FScanner::Compare(&this->sc,"cast");
      if (bVar1) {
        pFVar3 = (FIntermissionActionTextscreen *)operator_new(0x80);
        FIntermissionActionCast::FIntermissionActionCast((FIntermissionActionCast *)pFVar3);
        local_20 = pFVar3;
      }
      else {
        bVar1 = FScanner::Compare(&this->sc,"Fader");
        if (bVar1) {
          pFVar3 = (FIntermissionActionTextscreen *)operator_new(0x68);
          FIntermissionActionFader::FIntermissionActionFader((FIntermissionActionFader *)pFVar3);
          local_20 = pFVar3;
        }
        else {
          bVar1 = FScanner::Compare(&this->sc,"Wiper");
          if (bVar1) {
            pFVar3 = (FIntermissionActionTextscreen *)operator_new(0x68);
            FIntermissionActionWiper::FIntermissionActionWiper((FIntermissionActionWiper *)pFVar3);
            local_20 = pFVar3;
          }
          else {
            bVar1 = FScanner::Compare(&this->sc,"TextScreen");
            if (bVar1) {
              pFVar3 = (FIntermissionActionTextscreen *)operator_new(0x80);
              FIntermissionActionTextscreen::FIntermissionActionTextscreen(pFVar3);
              local_20 = pFVar3;
            }
            else {
              bVar1 = FScanner::Compare(&this->sc,"GotoTitle");
              if (bVar1) {
                pFVar3 = (FIntermissionActionTextscreen *)operator_new(0x60);
                FIntermissionAction::FIntermissionAction((FIntermissionAction *)pFVar3);
                (pFVar3->super_FIntermissionAction).mClass = (PClass *)0xfffffffffffffffe;
                local_20 = pFVar3;
              }
              else {
                bVar1 = FScanner::Compare(&this->sc,"Link");
                if (bVar1) {
                  FScanner::MustGetToken(&this->sc,0x3d);
                  FScanner::MustGetToken(&this->sc,0x101);
                  FName::operator=((FName *)ac,(this->sc).String);
                  return;
                }
                FScanner::ScriptMessage
                          (&this->sc,"Unknown intermission type \'%s\'",(this->sc).String);
              }
            }
          }
        }
      }
    }
  }
  FScanner::MustGetToken(&this->sc,0x7b);
  while (bVar1 = FScanner::CheckToken(&this->sc,0x7d), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_2d = 0;
    bVar1 = FScanner::CheckToken(&this->sc,0x14a);
    if (!bVar1) {
      FScanner::MustGetToken(&this->sc,0x101);
    }
    if (local_20 != (FIntermissionActionTextscreen *)0x0) {
      uVar2 = (*(local_20->super_FIntermissionAction)._vptr_FIntermissionAction[2])(local_20,this);
      local_2d = (byte)uVar2 & 1;
      if ((uVar2 & 1) == 0) {
        FScanner::ScriptMessage(&this->sc,"Unknown key name \'%s\'\n",(this->sc).String);
      }
    }
    if (local_2d == 0) {
      SkipToNext(this);
    }
  }
  if (local_20 != (FIntermissionActionTextscreen *)0x0) {
    TArray<FIntermissionAction_*,_FIntermissionAction_*>::Push
              ((TArray<FIntermissionAction_*,_FIntermissionAction_*> *)&ac->mSize,
               (FIntermissionAction **)&local_20);
  }
  return;
}

Assistant:

void FMapInfoParser::ParseIntermissionAction(FIntermissionDescriptor *desc)
{
	FIntermissionAction *ac = NULL;

	sc.MustGetToken(TK_Identifier);
	if (sc.Compare("image"))
	{
		ac = new FIntermissionAction;
	}
	else if (sc.Compare("scroller"))
	{
		ac = new FIntermissionActionScroller;
	}
	else if (sc.Compare("cast"))
	{
		ac = new FIntermissionActionCast;
	}
	else if (sc.Compare("Fader"))
	{
		ac = new FIntermissionActionFader;
	}
	else if (sc.Compare("Wiper"))
	{
		ac = new FIntermissionActionWiper;
	}
	else if (sc.Compare("TextScreen"))
	{
		ac = new FIntermissionActionTextscreen;
	}
	else if (sc.Compare("GotoTitle"))
	{
		ac = new FIntermissionAction;
		ac->mClass = TITLE_ID;
	}
	else if (sc.Compare("Link"))
	{
		sc.MustGetToken('=');
		sc.MustGetToken(TK_Identifier);
		desc->mLink = sc.String;
		return;
	}
	else
	{
		sc.ScriptMessage("Unknown intermission type '%s'", sc.String);
	}

	sc.MustGetToken('{');
	while (!sc.CheckToken('}'))
	{
		bool success = false;
		if (!sc.CheckToken(TK_Sound))
		{
			sc.MustGetToken(TK_Identifier);
		}
		if (ac != NULL)
		{
			success = ac->ParseKey(sc);
			if (!success)
			{
				sc.ScriptMessage("Unknown key name '%s'\n", sc.String);
			}
		}
		if (!success) SkipToNext();
	}
	if (ac != NULL) desc->mActions.Push(ac);
}